

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condvar.c
# Opt level: O0

void nn_condvar_term(nn_condvar_t *cond)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  pthread_cond_t *in_RDI;
  int rc;
  
  uVar1 = pthread_cond_destroy(in_RDI);
  if (uVar1 != 0) {
    nn_backtrace_print();
    __stream = _stderr;
    pcVar2 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)uVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/condvar.c"
            ,99);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

void nn_condvar_term (nn_condvar_t *cond)
{
    int rc;

    /* This should never fail, the system is allowed to return EBUSY if
       there are outstanding waiters (a serious bug!), or EINVAL if the
       cv is somehow invalid or illegal.  Either of these cases would
       represent a serious programming defect in our caller. */
    rc = pthread_cond_destroy (&cond->cv);
    errnum_assert (rc == 0, rc);
}